

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef
BinaryenStore(BinaryenModuleRef module,uint32_t bytes,uint32_t offset,uint32_t align,
             BinaryenExpressionRef ptr,BinaryenExpressionRef value,BinaryenType type,
             char *memoryName)

{
  Store *pSVar1;
  Address offset_00;
  Name memory;
  Builder local_38;
  
  offset_00.addr._4_4_ = 0;
  offset_00.addr._0_4_ = offset;
  if (align == 0) {
    align = bytes;
  }
  local_38.wasm = module;
  memory = getMemoryName(module,memoryName);
  pSVar1 = wasm::Builder::makeStore(&local_38,bytes,offset_00,align,ptr,value,(Type)type,memory);
  return (BinaryenExpressionRef)pSVar1;
}

Assistant:

BinaryenExpressionRef BinaryenStore(BinaryenModuleRef module,
                                    uint32_t bytes,
                                    uint32_t offset,
                                    uint32_t align,
                                    BinaryenExpressionRef ptr,
                                    BinaryenExpressionRef value,
                                    BinaryenType type,
                                    const char* memoryName) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeStore(bytes,
                 offset,
                 align ? align : bytes,
                 (Expression*)ptr,
                 (Expression*)value,
                 Type(type),
                 getMemoryName(module, memoryName)));
}